

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall
DomLayoutDefault::read(DomLayoutDefault *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  undefined4 in_register_00000034;
  QStringView *size;
  long in_FS_OFFSET;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  QStringView *in_stack_fffffffffffffe60;
  QStringView *a;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  QStringView *in_stack_fffffffffffffe70;
  undefined6 in_stack_fffffffffffffe78;
  byte in_stack_fffffffffffffe7e;
  byte in_stack_fffffffffffffe7f;
  const_iterator local_28 [4];
  long local_8;
  
  size = (QStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe60);
  o = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe60);
  while (bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,o), bVar1) {
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x19da70);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)
               CONCAT17(in_stack_fffffffffffffe7f,
                        CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
               (size_t)in_stack_fffffffffffffe70);
    QStringView::QStringView<QString,_true>
              (in_stack_fffffffffffffe70,
               (QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    in_stack_fffffffffffffe7f =
         ::operator==(in_stack_fffffffffffffe60,
                      (QStringView *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    QString::~QString((QString *)0x19dad4);
    if ((in_stack_fffffffffffffe7f & 1) == 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)
                 CONCAT17(in_stack_fffffffffffffe7f,
                          CONCAT16(in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78)),
                 (size_t)in_stack_fffffffffffffe70);
      QStringView::QStringView<QString,_true>
                (in_stack_fffffffffffffe70,
                 (QString *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      in_stack_fffffffffffffe7e =
           ::operator==(in_stack_fffffffffffffe60,
                        (QStringView *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
                       );
      QString::~QString((QString *)0x19db73);
      if ((in_stack_fffffffffffffe7e & 1) == 0) {
        in_stack_fffffffffffffe70 = size;
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                   (size_t)in_stack_fffffffffffffe60);
        ::operator+((QLatin1String *)in_stack_fffffffffffffe60,
                    (QStringView *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        QXmlStreamReader::raiseError((QString *)in_stack_fffffffffffffe70);
        QString::~QString((QString *)0x19dc37);
      }
      else {
        QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19db87);
        iVar2 = QStringView::toInt((QStringView *)
                                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                   (bool *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        setAttributeMargin(this,iVar2);
      }
    }
    else {
      QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19dae8);
      iVar2 = QStringView::toInt((QStringView *)
                                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                 (bool *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      setAttributeSpacing(this,iVar2);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x19dc55);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0019dd49;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      a = size;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(iVar2,in_stack_fffffffffffffe68),(size_t)size);
      ::operator+((QLatin1String *)a,
                  (QStringView *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      QXmlStreamReader::raiseError((QString *)a);
      QString::~QString((QString *)0x19dd2e);
    }
  } while (iVar2 != 5);
LAB_0019dd49:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x19dd56);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomLayoutDefault::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"spacing"_s) {
            setAttributeSpacing(attribute.value().toInt());
            continue;
        }
        if (name == u"margin"_s) {
            setAttributeMargin(attribute.value().toInt());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}